

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# path.cc
# Opt level: O3

void __thiscall
tchecker::zg::path::symbolic::lasso_path_t::attributes
          (lasso_path_t *this,node_t *n,
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *m)

{
  byte bVar1;
  mapped_type *pmVar2;
  key_type local_38;
  
  tchecker::ts::
  lasso_path_t<tchecker::zg::zg_t,_tchecker::zg::path::symbolic::node_t,_tchecker::zg::path::symbolic::edge_t>
  ::attributes(&this->
                super_lasso_path_t<tchecker::zg::zg_t,_tchecker::zg::path::symbolic::node_t,_tchecker::zg::path::symbolic::edge_t>
               ,n,m);
  bVar1 = (n->super_node_flags_t)._flags;
  if (((n->super_node_flags_t).NODE_INITIAL & bVar1) != 0) {
    local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_38,"initial","");
    pmVar2 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](m,&local_38);
    std::__cxx11::string::_M_replace((ulong)pmVar2,0,(char *)pmVar2->_M_string_length,0x1fd099);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_38._M_dataplus._M_p != &local_38.field_2) {
      operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
    }
    bVar1 = (n->super_node_flags_t)._flags;
  }
  if (((n->super_node_flags_t).NODE_FINAL & bVar1) != 0) {
    local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_38,"final","");
    pmVar2 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](m,&local_38);
    std::__cxx11::string::_M_replace((ulong)pmVar2,0,(char *)pmVar2->_M_string_length,0x1fd099);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_38._M_dataplus._M_p != &local_38.field_2) {
      operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
    }
  }
  return;
}

Assistant:

void lasso_path_t::attributes(tchecker::zg::path::symbolic::node_t const & n, std::map<std::string, std::string> & m) const
{
  tchecker::ts::lasso_path_t<tchecker::zg::zg_t, tchecker::zg::path::symbolic::node_t,
                             tchecker::zg::path::symbolic::edge_t>::attributes(n, m);
  if (n.initial())
    m["initial"] = "true";
  if (n.final())
    m["final"] = "true";
}